

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqstate.cpp
# Opt level: O0

void __thiscall RefTable::Finalize(RefTable *this)

{
  SQObjectPtr *in_RDI;
  SQUnsignedInteger n;
  RefNode *nodes;
  ulong local_18;
  
  for (local_18 = 0; local_18 < *(ulong *)&in_RDI->super_SQObject; local_18 = local_18 + 1) {
    ::SQObjectPtr::Null(in_RDI);
  }
  return;
}

Assistant:

void RefTable::Finalize()
{
    RefNode *nodes = _nodes;
    for(SQUnsignedInteger n = 0; n < _numofslots; n++) {
        nodes->obj.Null();
        nodes++;
    }
}